

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte bVar2;
  xmlChar xVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  byte *pbVar6;
  startElementSAXFunc p_Var7;
  int iVar8;
  int iVar9;
  xmlChar *str2;
  xmlChar **ppxVar10;
  xmlChar **ppxVar11;
  long lVar12;
  int iVar13;
  xmlChar *attvalue;
  xmlChar *q;
  xmlChar *local_58;
  int local_4c;
  xmlChar *local_48;
  byte *local_40;
  ulong local_38;
  
  pxVar4 = ctxt->input;
  pxVar5 = pxVar4->cur;
  if (*pxVar5 == '<') {
    ppxVar11 = ctxt->atts;
    local_4c = ctxt->maxatts;
    pxVar4->col = pxVar4->col + 1;
    pxVar4->cur = pxVar5 + 1;
    if (pxVar5[1] == '\0') {
      xmlParserInputGrow(pxVar4,0xfa);
    }
    local_48 = xmlParseName(ctxt);
    if (local_48 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar13 = 0;
      do {
        pbVar6 = ctxt->input->cur;
        bVar1 = *pbVar6;
        bVar2 = bVar1;
        if (bVar1 == 0x2f) {
          bVar2 = pbVar6[1];
        }
        if ((bVar2 == 0x3e) ||
           (((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20)) ||
            (ctxt->instate == XML_PARSER_EOF)))) break;
        local_38 = (ulong)(uint)ctxt->input->consumed;
        local_40 = pbVar6;
        str2 = xmlParseAttribute(ctxt,&local_58);
        pxVar5 = local_58;
        if (local_58 == (xmlChar *)0x0 || str2 == (xmlChar *)0x0) {
          if (local_58 != (xmlChar *)0x0) {
            (*xmlFree)(local_58);
          }
LAB_00165e59:
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          pxVar5 = ctxt->input->cur;
          xVar3 = *pxVar5;
          iVar8 = 3;
          if ((xVar3 != '>') && ((xVar3 != '/' || (pxVar5[1] != '>')))) {
            iVar9 = xmlSkipBlankChars(ctxt);
            if (iVar9 == 0) {
              xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"attributes construct error\n");
            }
            pxVar4 = ctxt->input;
            if ((((local_38 == pxVar4->consumed) && (str2 == (xmlChar *)0x0)) &&
                (local_40 == pxVar4->cur)) && (local_58 == (xmlChar *)0x0)) {
              xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,
                             "xmlParseStartTag: problem parsing attributes\n");
            }
            else {
              if (((ctxt->progressive == 0) && (500 < (long)pxVar4->cur - (long)pxVar4->base)) &&
                 ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
                xmlSHRINK(ctxt);
              }
              iVar8 = 0;
              if ((ctxt->progressive == 0) &&
                 (iVar8 = 0, (long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                xmlGROW(ctxt);
              }
            }
          }
        }
        else {
          if (0 < iVar13) {
            lVar12 = 0;
            do {
              iVar8 = xmlStrEqual(ppxVar11[lVar12],str2);
              if (iVar8 != 0) {
                xmlErrAttributeDup(ctxt,(xmlChar *)0x0,str2);
                (*xmlFree)(pxVar5);
                goto LAB_00165e59;
              }
              lVar12 = lVar12 + 2;
            } while ((int)lVar12 < iVar13);
          }
          if (ppxVar11 == (xmlChar **)0x0) {
            ppxVar11 = (xmlChar **)(*xmlMalloc)(0xb0);
            if (ppxVar11 != (xmlChar **)0x0) {
              ctxt->atts = ppxVar11;
              ctxt->maxatts = 0x16;
              local_4c = 0x16;
              goto LAB_00165e16;
            }
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxVar5);
            local_4c = 0x16;
            ppxVar11 = (xmlChar **)0x0;
            goto LAB_00165e59;
          }
          if (iVar13 + 4 <= local_4c) {
LAB_00165e16:
            ppxVar11[iVar13] = str2;
            ppxVar11[(long)iVar13 + 1] = local_58;
            ppxVar11[(long)iVar13 + 2] = (xmlChar *)0x0;
            (ppxVar11 + (long)iVar13 + 2)[1] = (xmlChar *)0x0;
            iVar13 = iVar13 + 2;
            goto LAB_00165e59;
          }
          iVar8 = local_4c * 2;
          ppxVar10 = (xmlChar **)(*xmlRealloc)(ppxVar11,(long)iVar8 << 3);
          local_4c = iVar8;
          if (ppxVar10 == (xmlChar **)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            iVar8 = 7;
            if (local_58 != (xmlChar *)0x0) {
              (*xmlFree)(local_58);
            }
          }
          else {
            ctxt->atts = ppxVar10;
            ctxt->maxatts = iVar8;
            iVar8 = 0;
            ppxVar11 = ppxVar10;
          }
          if (iVar8 == 7) goto LAB_00165e59;
          if (iVar8 == 0) goto LAB_00165e16;
        }
      } while (iVar8 == 0);
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (p_Var7 = ctxt->sax->startElement, p_Var7 != (startElementSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        ppxVar10 = (xmlChar **)0x0;
        if (0 < iVar13) {
          ppxVar10 = ppxVar11;
        }
        (*p_Var7)(ctxt->userData,local_48,ppxVar10);
      }
      if (iVar13 < 2 || ppxVar11 == (xmlChar **)0x0) {
        return local_48;
      }
      lVar12 = 1;
      do {
        if (ppxVar11[lVar12] != (xmlChar *)0x0) {
          (*xmlFree)(ppxVar11[lVar12]);
        }
        lVar12 = lVar12 + 2;
      } while ((int)lVar12 < iVar13);
      return local_48;
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (ctxt->instate != XML_PARSER_EOF)) {
	const xmlChar *q = CUR_PTR;
	unsigned int cons = ctxt->input->consumed;

	attname = xmlParseAttribute(ctxt, &attvalue);
        if ((attname != NULL) && (attvalue != NULL)) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    xmlFree(attvalue);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	} else {
	    if (attvalue != NULL)
		xmlFree(attvalue);
	}

failed:

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
        if ((cons == ctxt->input->consumed) && (q == CUR_PTR) &&
            (attname == NULL) && (attvalue == NULL)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			   "xmlParseStartTag: problem parsing attributes\n");
	    break;
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}